

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O1

void __thiscall
pstore::database::check_get_params(database *this,address addr,size_t size,bool writable)

{
  ulong uVar1;
  
  if (this->closed_ == true) {
    raise<pstore::error_code>(store_closed);
  }
  if ((writable) &&
     (addr.a_ < (((this->header_).super___shared_ptr<pstore::header,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->footer_pos)._M_i.a_.a_ + 0x70)) {
    raise<pstore::error_code,char[50]>
              (read_only_address,(char (*) [50])"An attempt was made to write to read-only storage")
    ;
  }
  uVar1 = (this->size_).logical_;
  if ((addr.a_ <= uVar1) && (size <= uVar1 - addr.a_)) {
    return;
  }
  raise<pstore::error_code>(bad_address);
}

Assistant:

void database::check_get_params (address const addr, std::size_t const size,
                                     bool const writable) const {
        if (closed_) {
            raise (pstore::error_code::store_closed);
        }

        if (writable && addr < first_writable_address ()) {
            raise (error_code::read_only_address,
                   "An attempt was made to write to read-only storage");
        }
        std::uint64_t const start = addr.absolute ();
        std::uint64_t const logical_size = size_.logical_size ();
        if (start > logical_size || size > logical_size - start) {
            raise (error_code::bad_address);
        }
    }